

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O1

void lj_gc_fullgc(lua_State *L)

{
  char cVar1;
  undefined4 uVar2;
  uint64_t uVar3;
  
  uVar3 = (L->glref).ptr64;
  uVar2 = *(undefined4 *)(uVar3 + 0xb8);
  *(undefined4 *)(uVar3 + 0xb8) = 0xfffffffd;
  if (*(byte *)(uVar3 + 0x21) < 3) {
    *(uint64_t *)(uVar3 + 0x30) = uVar3 + 0x28;
    *(undefined8 *)(uVar3 + 0x38) = 0;
    *(undefined8 *)(uVar3 + 0x40) = 0;
    *(undefined8 *)(uVar3 + 0x48) = 0;
    *(undefined1 *)(uVar3 + 0x21) = 3;
    *(undefined4 *)(uVar3 + 0x24) = 0;
  }
  cVar1 = *(char *)(uVar3 + 0x21);
  while ((byte)(cVar1 - 3U) < 2) {
    gc_onestep(L);
    cVar1 = *(char *)(uVar3 + 0x21);
  }
  *(undefined1 *)(uVar3 + 0x21) = 0;
  do {
    gc_onestep(L);
  } while (*(char *)(uVar3 + 0x21) != '\0');
  *(ulong *)(uVar3 + 0x18) = (ulong)*(uint *)(uVar3 + 0x6c) * (*(ulong *)(uVar3 + 0x60) / 100);
  *(undefined4 *)(uVar3 + 0xb8) = uVar2;
  return;
}

Assistant:

void lj_gc_fullgc(lua_State *L)
{
  global_State *g = G(L);
  int32_t ostate = g->vmstate;
  setvmstate(g, GC);
  if (g->gc.state <= GCSatomic) {  /* Caught somewhere in the middle. */
    setmref(g->gc.sweep, &g->gc.root);  /* Sweep everything (preserving it). */
    setgcrefnull(g->gc.gray);  /* Reset lists from partial propagation. */
    setgcrefnull(g->gc.grayagain);
    setgcrefnull(g->gc.weak);
    g->gc.state = GCSsweepstring;  /* Fast forward to the sweep phase. */
    g->gc.sweepstr = 0;
  }
  while (g->gc.state == GCSsweepstring || g->gc.state == GCSsweep)
    gc_onestep(L);  /* Finish sweep. */
  lj_assertG(g->gc.state == GCSfinalize || g->gc.state == GCSpause,
	     "bad GC state");
  /* Now perform a full GC. */
  g->gc.state = GCSpause;
  do { gc_onestep(L); } while (g->gc.state != GCSpause);
  g->gc.threshold = (g->gc.estimate/100) * g->gc.pause;
  g->vmstate = ostate;
}